

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
* toml::detail::parse_file<toml::type_config>
            (result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  element_type *peVar3;
  long *plVar4;
  pointer pcVar5;
  string *psVar6;
  undefined1 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [8];
  pointer pbVar10;
  pointer pbVar11;
  table_format_info *ptVar12;
  value_type *pvVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  error_type *peVar15;
  value_type *pvVar16;
  error_type *peVar17;
  table_type *ptVar18;
  value_type *ppbVar19;
  error_type *peVar20;
  basic_value<toml::type_config> *extraout_RDX;
  basic_value<toml::type_config> *extraout_RDX_00;
  basic_value<toml::type_config> *extraout_RDX_01;
  basic_value<toml::type_config> *extraout_RDX_02;
  basic_value<toml::type_config> *extraout_RDX_03;
  basic_value<toml::type_config> *pbVar21;
  basic_value<toml::type_config> *extraout_RDX_04;
  basic_value<toml::type_config> *v;
  context<toml::type_config> *__str;
  location *plVar22;
  location *plVar23;
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var24;
  EVP_PKEY_CTX *pEVar25;
  basic_value<toml::type_config> *pbVar26;
  _Alloc_hider _Var27;
  int32_t iVar28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar29;
  pointer pbVar30;
  long lVar31;
  int iVar32;
  scanner_storage *other;
  ulong uVar33;
  undefined8 uVar34;
  initializer_list<unsigned_char> cs;
  table_format_info fmt;
  table_format_info fmt_00;
  optional<toml::detail::multiline_spacer<toml::type_config>_> sp;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> inserted;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  com;
  result<toml::detail::none_t,_toml::error_info> res_1;
  result<toml::detail::none_t,_toml::error_info> res;
  value_type com_opt;
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  com_res;
  location first;
  value_type root;
  undefined1 local_13d8 [16];
  scanner_storage local_13c8 [2];
  bool local_13b8;
  literal local_13b0;
  undefined1 local_1398 [8];
  failure<toml::error_info> local_1390;
  pointer local_1338;
  pointer pbStack_1330;
  pointer local_1328;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  *local_1318;
  _func_int **local_1310;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1308;
  undefined1 local_12e8 [16];
  _Alloc_hider local_12d8;
  pointer local_12d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_12c8;
  size_t local_12b8;
  size_t sStack_12b0;
  undefined4 local_12a8;
  undefined4 uStack_12a4;
  undefined4 uStack_12a0;
  undefined4 uStack_129c;
  size_t local_1298;
  size_t sStack_1290;
  size_t local_1288;
  undefined1 local_1278 [8];
  anon_union_88_2_fd5fb55d_for_result<toml::detail::none_t,_toml::error_info>_3 local_1270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1210;
  size_t *local_1208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1200;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_11f8;
  undefined **local_11f0;
  undefined1 local_11e8;
  string local_11e0;
  string local_11c0;
  string local_11a0;
  string local_1180;
  string local_1160;
  string local_1140;
  string local_1120;
  string local_1100;
  comment_type *local_10e0;
  ulong local_10d8;
  comment_type *local_10d0;
  undefined1 local_10c8 [8];
  undefined1 auStack_10c0 [168];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_1018;
  error_info local_ff8;
  undefined1 local_fa0 [16];
  undefined *local_f90 [15];
  undefined1 local_f18 [56];
  _Alloc_hider local_ee0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ed0;
  undefined1 local_ec0 [56];
  _Alloc_hider local_e88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e78;
  undefined1 local_e68 [56];
  _Alloc_hider local_e30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e20;
  undefined1 local_e10 [56];
  _Alloc_hider local_dd8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_dc8;
  undefined1 local_db8 [56];
  _Alloc_hider local_d80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d70;
  undefined1 local_d60 [56];
  _Alloc_hider local_d28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d18;
  undefined1 local_d08 [56];
  _Alloc_hider local_cd0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_cc0;
  undefined1 local_cb0 [56];
  _Alloc_hider local_c78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c38;
  undefined1 local_c20 [8];
  undefined1 local_c18 [168];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b38;
  undefined1 local_b20 [56];
  _Alloc_hider local_ae8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ad8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_ac8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a90;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a58;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a20;
  error_info local_9e8;
  error_info local_990;
  error_info local_938;
  error_info local_8e0;
  undefined1 local_888 [48];
  size_t local_858;
  size_t sStack_850;
  size_t local_848;
  undefined1 local_840 [176];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_790;
  region local_778;
  region local_708;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_698;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_660;
  location local_628;
  location local_5e0;
  location local_598;
  location local_550;
  vector<toml::error_info,_std::allocator<toml::error_info>_> local_508;
  region local_4f0;
  region local_488;
  basic_value<toml::type_config> local_420;
  basic_value<toml::type_config> local_358;
  basic_value<toml::type_config> local_290;
  basic_value<toml::type_config> local_1c8;
  region local_100;
  region local_98;
  
  local_1318 = __return_storage_ptr__;
  location::location((location *)local_888,loc);
  peVar3 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (loc->location_ <
      (ulong)((long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start)) {
    local_698._M_buckets = &local_698._M_single_bucket;
    local_698._M_bucket_count = 1;
    local_698._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_698._M_element_count = 0;
    local_698._M_rehash_policy._M_max_load_factor = 1.0;
    local_698._M_rehash_policy._4_4_ = 0;
    local_698._M_rehash_policy._M_next_resize = 0;
    local_698._M_single_bucket = (__node_base_ptr)0x0;
    local_c58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    region::region(&local_4f0,loc);
    basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)local_840,(table_type *)&local_698,
               (table_format_info)ZEXT816(0),&local_c58,&local_4f0);
    region::~region(&local_4f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c58);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_698);
    ptVar12 = basic_value<toml::type_config>::as_table_fmt
                        ((basic_value<toml::type_config> *)local_840);
    ptVar12->fmt = multiline;
    ptVar12 = basic_value<toml::type_config>::as_table_fmt
                        ((basic_value<toml::type_config> *)local_840);
    local_1208 = &loc->location_;
    ptVar12->indent_type = none;
    pbVar26 = (basic_value<toml::type_config> *)&ctx->errors_;
    local_11f8 = &(loc->source_).
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount;
    local_1200 = &loc->source_name_;
    local_1310 = (_func_int **)&PTR__repeat_at_least_00555b08;
    do {
      paVar29 = &local_ff8.title_.field_2;
      peVar3 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if ((ulong)((long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start) <= loc->location_) break;
      parse_comment_line<toml::type_config>
                ((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                  *)local_c20,loc,ctx);
      if (local_c20[0] == true) {
        pvVar13 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                  ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                            *)local_c20,(source_location)0x555c48);
        local_f90[2]._0_1_ = '\0';
        bVar2 = (pvVar13->
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged;
        if (bVar2 == true) {
          _Var27._M_p = (pvVar13->
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_dataplus._M_p;
          local_fa0._0_8_ = local_f90;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_fa0,_Var27._M_p,
                     _Var27._M_p +
                     (pvVar13->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload._M_value._M_string_length);
          local_f90[2]._0_1_ = '\x01';
          iVar32 = 0;
          __str = (context<toml::type_config> *)local_fa0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_790
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
        }
        else {
          local_1278._0_2_ = 0x920;
          cs._M_len = 2;
          cs._M_array = (iterator)local_1278;
          character_either::character_either((character_either *)local_12e8,cs);
          local_13d8._0_8_ = local_1310;
          local_13d8._8_8_ = (pointer)0x0;
          scanner_storage::scanner_storage<toml::detail::character_either,_nullptr>
                    (local_13c8,(character_either *)local_12e8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_12e8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            operator_delete((void *)local_12e8._8_8_,(long)local_12d0 - local_12e8._8_8_);
          }
          local_13b0.super_scanner_base._vptr_scanner_base =
               (_func_int **)&PTR__scanner_base_00555890;
          local_13b0.value_ = (char *)CONCAT71(local_13b0.value_._1_7_,10);
          local_1278 = (undefined1  [8])&PTR__scanner_base_005559a8;
          local_1270.fail_.value.title_._M_dataplus._M_p = (_Alloc_hider)"\r\n";
          local_1270.fail_.value.title_._M_string_length = 2;
          either::either<toml::detail::character,toml::detail::literal>
                    ((either *)local_12e8,(character *)&local_13b0,(literal *)local_1278);
          __str = (context<toml::type_config> *)local_1398;
          sequence::sequence<toml::detail::repeat_at_least,toml::detail::either>
                    ((sequence *)__str,(repeat_at_least *)local_13d8,(either *)local_12e8);
          sequence::scan((region *)local_10c8,(sequence *)__str,loc);
          auVar9 = local_10c8;
          region::~region((region *)local_10c8);
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)(local_1398 + 8));
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)(local_12e8 + 8));
          if ((_Head_base<0UL,_toml::detail::scanner_base_*,_false>)
              local_13c8[0].scanner_._M_t.
              super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
              ._M_t.
              super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
              .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
              (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)0x0) {
            (**(_func_int **)
               ((long)((_Alloc_hider *)
                      local_13c8[0].scanner_._M_t.
                      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)->
                      _M_p + 8))();
          }
          iVar32 = 3;
          if (auVar9 == (undefined1  [8])0x0) {
            (loc->source_).
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)local_888._0_8_;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (local_11f8,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_888 + 8));
            __str = (context<toml::type_config> *)(local_888 + 0x10);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign(local_1200,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
            pbVar11 = local_790.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pbVar10 = local_790.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_1208[2] = local_848;
            *local_1208 = local_858;
            local_1208[1] = sStack_850;
            if (local_790.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_790.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar29 = &(local_790.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_2;
              do {
                plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(paVar29 + -1))->_M_dataplus)._M_p;
                if (paVar29 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar4) {
                  __str = (context<toml::type_config> *)(paVar29->_M_allocated_capacity + 1);
                  operator_delete(plVar4,(ulong)__str);
                }
                pbVar30 = (pointer)(paVar29 + 1);
                paVar29 = paVar29 + 2;
              } while (pbVar30 != pbVar11);
              local_790.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar10;
            }
          }
        }
        if ((local_f90[2]._0_1_ == '\x01') &&
           (local_f90[2]._0_1_ = '\0', (undefined **)local_fa0._0_8_ != local_f90)) {
          __str = (context<toml::type_config> *)((long)&((_Alloc_hider *)local_f90[0])->_M_p + 1);
          operator_delete((void *)local_fa0._0_8_,(ulong)__str);
        }
        if (bVar2 != false) goto LAB_003b80b2;
      }
      else {
        peVar17 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                  ::unwrap_err((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                *)local_c20,(source_location)0x555c60);
        local_ff8.title_._M_dataplus._M_p = (peVar17->title_)._M_dataplus._M_p;
        paVar14 = &(peVar17->title_).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ff8.title_._M_dataplus._M_p == paVar14) {
          local_ff8.title_.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_ff8.title_.field_2._8_8_ = *(undefined8 *)((long)&(peVar17->title_).field_2 + 8);
          local_ff8.title_._M_dataplus._M_p = (pointer)paVar29;
        }
        else {
          local_ff8.title_.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        }
        paVar1 = &local_ff8.suffix_.field_2;
        local_ff8.title_._M_string_length = (peVar17->title_)._M_string_length;
        (peVar17->title_)._M_dataplus._M_p = (pointer)paVar14;
        (peVar17->title_)._M_string_length = 0;
        (peVar17->title_).field_2._M_local_buf[0] = '\0';
        local_ff8.locations_.
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (peVar17->locations_).
             super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_ff8.locations_.
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (peVar17->locations_).
             super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_ff8.locations_.
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (peVar17->locations_).
             super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (peVar17->locations_).
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (peVar17->locations_).
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (peVar17->locations_).
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_ff8.suffix_._M_dataplus._M_p = (peVar17->suffix_)._M_dataplus._M_p;
        paVar14 = &(peVar17->suffix_).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ff8.suffix_._M_dataplus._M_p == paVar14) {
          local_ff8.suffix_.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_ff8.suffix_.field_2._8_8_ = *(undefined8 *)((long)&(peVar17->suffix_).field_2 + 8);
          local_ff8.suffix_._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_ff8.suffix_.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        }
        local_ff8.suffix_._M_string_length = (peVar17->suffix_)._M_string_length;
        (peVar17->suffix_)._M_dataplus._M_p = (pointer)paVar14;
        (peVar17->suffix_)._M_string_length = 0;
        (peVar17->suffix_).field_2._M_local_buf[0] = '\0';
        std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
        emplace_back<toml::error_info>
                  ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar26,&local_ff8
                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ff8.suffix_._M_dataplus._M_p != paVar1) {
          operator_delete(local_ff8.suffix_._M_dataplus._M_p,
                          local_ff8.suffix_.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_ff8.locations_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ff8.title_._M_dataplus._M_p != paVar29) {
          operator_delete(local_ff8.title_._M_dataplus._M_p,
                          local_ff8.title_.field_2._M_allocated_capacity + 1);
        }
        __str = ctx;
        skip_comment_block<toml::type_config>(loc,ctx);
LAB_003b80b2:
        iVar32 = 0;
      }
      result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
      ::cleanup((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                 *)local_c20,(EVP_PKEY_CTX *)__str);
    } while (iVar32 == 0);
    parse_table<toml::type_config>
              ((result<toml::detail::none_t,_toml::error_info> *)local_10c8,loc,ctx,
               (basic_value<toml::type_config> *)local_840);
    pbVar21 = extraout_RDX;
    if ((bool)local_10c8[0] == false) {
      peVar15 = result<toml::detail::none_t,_toml::error_info>::unwrap_err
                          ((result<toml::detail::none_t,_toml::error_info> *)local_10c8,
                           (source_location)0x555c78);
      pcVar5 = (peVar15->title_)._M_dataplus._M_p;
      local_b20._0_8_ = local_b20 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b20,pcVar5,pcVar5 + (peVar15->title_)._M_string_length);
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_b20 + 0x20),&peVar15->locations_);
      pcVar5 = (peVar15->suffix_)._M_dataplus._M_p;
      local_ae8._M_p = (pointer)&local_ad8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_ae8,pcVar5,pcVar5 + (peVar15->suffix_)._M_string_length);
      std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
      emplace_back<toml::error_info>
                ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar26,
                 (error_info *)local_b20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ae8._M_p != &local_ad8) {
        operator_delete(local_ae8._M_p,local_ad8._M_allocated_capacity + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_b20 + 0x20));
      if ((undefined1 *)local_b20._0_8_ != local_b20 + 0x10) {
        operator_delete((void *)local_b20._0_8_,local_b20._16_8_ + 1);
      }
      skip_until_next_table<toml::type_config>(loc,ctx);
      pbVar21 = extraout_RDX_00;
    }
    if ((local_10c8[0] & 1) == 0) {
      failure<toml::error_info>::~failure((failure<toml::error_info> *)auStack_10c0);
      pbVar21 = extraout_RDX_01;
    }
    peVar3 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (loc->location_ <
        (ulong)((long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start)) {
      local_10e0 = &local_358.comments_;
      local_1218 = &local_b70;
      local_1210 = &vStack_1018;
      local_10d0 = &local_290.comments_;
      do {
        skip_multiline_spacer<toml::type_config>
                  ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)local_13d8,loc,
                   ctx,true);
        plVar22 = loc;
        parse_array_table_key<toml::type_config>
                  ((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                    *)local_fa0,loc,ctx);
        plVar23 = loc;
        if (local_fa0[0] == (string)0x1) {
          pvVar16 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                    ::unwrap((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                              *)local_fa0,(source_location)0x555c90);
          local_1308.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pvVar16->first).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1308.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pvVar16->first).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_1308.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pvVar16->first).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (pvVar16->first).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pvVar16->first).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pvVar16->first).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pvVar16 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                    ::unwrap((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                              *)local_fa0,(source_location)0x555ca8);
          local_12e8._0_8_ =
               (pvVar16->second).source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          local_12e8._8_8_ =
               (pvVar16->second).source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          (pvVar16->second).source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (pvVar16->second).source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_12d8._M_p = (pointer)&local_12c8;
          paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pvVar16->second).source_name_._M_dataplus._M_p;
          paVar14 = &(pvVar16->second).source_name_.field_2;
          if (paVar29 == paVar14) {
            local_12c8._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_12c8._8_8_ = *(undefined8 *)((long)&(pvVar16->second).source_name_.field_2 + 8);
          }
          else {
            local_12c8._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_12d8._M_p = (pointer)paVar29;
          }
          local_12d0 = (pointer)(pvVar16->second).source_name_._M_string_length;
          (pvVar16->second).source_name_._M_dataplus._M_p = (pointer)paVar14;
          (pvVar16->second).source_name_._M_string_length = 0;
          (pvVar16->second).source_name_.field_2._M_local_buf[0] = '\0';
          local_1288 = (pvVar16->second).last_column_;
          local_12b8 = (pvVar16->second).length_;
          sStack_12b0 = (pvVar16->second).first_;
          local_12a8 = (undefined4)(pvVar16->second).first_line_;
          uStack_12a4 = *(undefined4 *)((long)&(pvVar16->second).first_line_ + 4);
          uStack_12a0 = (undefined4)(pvVar16->second).first_column_;
          uStack_129c = *(undefined4 *)((long)&(pvVar16->second).first_column_ + 4);
          local_1298 = (pvVar16->second).last_;
          sStack_1290 = (pvVar16->second).last_line_;
          local_1328 = (pointer)0x0;
          local_1338 = (pointer)0x0;
          pbStack_1330 = (pointer)0x0;
          if (local_13b8 == true) {
            uVar33 = 0xffffffffffffffff;
            lVar31 = 0;
            while (uVar33 = uVar33 + 1,
                  uVar33 < (ulong)((long)local_13c8[0].scanner_._M_t.
                                         super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                                         .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>
                                         ._M_head_impl - local_13d8._8_8_ >> 5)) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_1338,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((_Alloc_hider *)local_13d8._8_8_)->_M_p + lVar31));
              lVar31 = lVar31 + 0x20;
              if (local_13b8 == false) {
                std::__throw_bad_optional_access();
              }
            }
          }
          parse_comment_line<toml::type_config>
                    ((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                      *)local_c20,loc,ctx);
          if (local_c20[0] == true) {
            pvVar13 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                      ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                *)local_c20,(source_location)0x555cc0);
            local_1390.value.title_.field_2._M_local_buf[8] = '\0';
            if ((pvVar13->
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged == true) {
              local_1398 = (undefined1  [8])&local_1390.value.title_._M_string_length;
              _Var27._M_p = (pvVar13->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1398,_Var27._M_p,
                         _Var27._M_p +
                         (pvVar13->
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload._M_value._M_string_length);
              local_1390.value.title_.field_2._M_local_buf[8] = '\x01';
              _Var24._M_head_impl = (scanner_base *)local_1398;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_1338,(value_type *)_Var24._M_head_impl);
            }
            else {
              _Var24._M_head_impl = (scanner_base *)ctx;
              skip_whitespace<toml::type_config>(loc,ctx);
              peVar3 = (loc->source_).
                       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              if (loc->location_ <
                  (ulong)((long)(peVar3->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(peVar3->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_start)) {
                local_11f0 = &PTR__scanner_base_00555890;
                local_11e8 = 10;
                local_13b0.super_scanner_base._vptr_scanner_base =
                     (_func_int **)&PTR__scanner_base_005559a8;
                local_13b0.value_ = "\r\n";
                local_13b0.size_ = 2;
                _Var24._M_head_impl = (scanner_base *)&local_11f0;
                either::either<toml::detail::character,toml::detail::literal>
                          ((either *)local_1278,(character *)_Var24._M_head_impl,&local_13b0);
                uVar8 = local_1270.fail_.value.title_._M_string_length;
                for (uVar34 = local_1270.fail_.value.title_._M_dataplus._M_p; uVar34 != uVar8;
                    uVar34 = uVar34 + 8) {
                  _Var24._M_head_impl = *(scanner_base **)uVar34;
                  (**(code **)(*(long *)_Var24._M_head_impl + 0x10))
                            ((region *)local_10c8,_Var24._M_head_impl,loc);
                  auVar9 = local_10c8;
                  region::~region((region *)local_10c8);
                  if (auVar9 != (undefined1  [8])0x0) {
                    std::
                    vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                    ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                               *)&local_1270.fail_);
                    goto LAB_003b916e;
                  }
                }
                region::region((region *)local_10c8);
                auVar9 = local_10c8;
                region::~region((region *)local_10c8);
                std::
                vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                           *)&local_1270.fail_);
                if (auVar9 == (undefined1  [8])0x0) {
                  local_11c0._M_dataplus._M_p = (pointer)&local_11c0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_11c0,"toml::parse_file: newline (or EOF) expected","")
                  ;
                  local_13b0.super_scanner_base._vptr_scanner_base =
                       (_func_int **)&PTR__scanner_base_00555890;
                  local_13b0.value_ = (char *)CONCAT71(local_13b0.value_._1_7_,10);
                  local_1278 = (undefined1  [8])&PTR__scanner_base_005559a8;
                  local_1270.fail_.value.title_._M_dataplus._M_p = (_Alloc_hider)"\r\n";
                  local_1270.fail_.value.title_._M_string_length = 2;
                  either::either<toml::detail::character,toml::detail::literal>
                            ((either *)local_10c8,(character *)&local_13b0,(literal *)local_1278);
                  location::location(&local_550,loc);
                  local_1100._M_dataplus._M_p = (pointer)&local_1100.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1100,"");
                  make_syntax_error<toml::detail::either>
                            (&local_8e0,&local_11c0,(either *)local_10c8,&local_550,&local_1100);
                  std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
                  emplace_back<toml::error_info>
                            ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar26,
                             &local_8e0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_8e0.suffix_._M_dataplus._M_p != &local_8e0.suffix_.field_2) {
                    operator_delete(local_8e0.suffix_._M_dataplus._M_p,
                                    local_8e0.suffix_.field_2._M_allocated_capacity + 1);
                  }
                  std::
                  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector(&local_8e0.locations_);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_8e0.title_._M_dataplus._M_p != &local_8e0.title_.field_2) {
                    operator_delete(local_8e0.title_._M_dataplus._M_p,
                                    local_8e0.title_.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1100._M_dataplus._M_p != &local_1100.field_2) {
                    operator_delete(local_1100._M_dataplus._M_p,
                                    local_1100.field_2._M_allocated_capacity + 1);
                  }
                  location::~location(&local_550);
                  std::
                  vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                  ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                             *)auStack_10c0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_11c0._M_dataplus._M_p != &local_11c0.field_2) {
                    operator_delete(local_11c0._M_dataplus._M_p,
                                    local_11c0.field_2._M_allocated_capacity + 1);
                  }
                  plVar23 = (location *)ctx;
                  skip_until_next_table<toml::type_config>(loc,ctx);
LAB_003b9118:
                  if ((local_1390.value.title_.field_2._M_local_buf[8] == '\x01') &&
                     (local_1390.value.title_.field_2._M_local_buf[8] = '\0',
                     local_1398 != (undefined1  [8])&local_1390.value.title_._M_string_length)) {
                    plVar23 = (location *)(local_1390.value.title_._M_string_length + 1);
                    operator_delete((void *)local_1398,(ulong)plVar23);
                  }
                  goto LAB_003b8ade;
                }
              }
            }
LAB_003b916e:
            if ((local_1390.value.title_.field_2._M_local_buf[8] == '\x01') &&
               (local_1390.value.title_.field_2._M_local_buf[8] = '\0',
               local_1398 != (undefined1  [8])&local_1390.value.title_._M_string_length)) {
              _Var24._M_head_impl = (scanner_base *)(local_1390.value.title_._M_string_length + 1);
              operator_delete((void *)local_1398,(ulong)_Var24._M_head_impl);
            }
            result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
            ::cleanup((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                       *)local_c20,(EVP_PKEY_CTX *)_Var24._M_head_impl);
            local_a20._M_buckets = &local_a20._M_single_bucket;
            local_a20._M_bucket_count = 1;
            local_a20._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_a20._M_element_count = 0;
            local_a20._M_rehash_policy._M_max_load_factor = 1.0;
            local_a20._M_rehash_policy._4_4_ = 0;
            local_a20._M_rehash_policy._M_next_resize = 0;
            local_a20._M_single_bucket = (__node_base_ptr)0x0;
            local_b38.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = local_1338;
            local_b38.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbStack_1330;
            local_b38.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1328;
            local_1328 = (pointer)0x0;
            local_1338 = (pointer)0x0;
            pbStack_1330 = (pointer)0x0;
            region::region(&local_98,(region *)local_12e8);
            fmt._0_8_ = (_func_int **)((ulong)((uint)local_1310 & 0xffff0000) | 0x200);
            fmt.name_indent = 0;
            fmt.closing_indent = 0;
            local_1310 = fmt._0_8_;
            basic_value<toml::type_config>::basic_value
                      ((basic_value<toml::type_config> *)local_10c8,(table_type *)&local_a20,fmt,
                       &local_b38,&local_98);
            region::~region(&local_98);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_b38);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_a20);
            ptVar18 = basic_value<toml::type_config>::as_table_abi_cxx11_
                                ((basic_value<toml::type_config> *)local_840);
            local_708.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)local_12e8._0_8_;
            local_708.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_12e8._8_8_;
            local_12e8._0_8_ = (element_type *)0x0;
            local_12e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_708.source_name_._M_dataplus._M_p = (pointer)&local_708.source_name_.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_12d8._M_p == &local_12c8) {
              local_708.source_name_.field_2._8_8_ = local_12c8._8_8_;
            }
            else {
              local_708.source_name_._M_dataplus._M_p = local_12d8._M_p;
            }
            local_708.source_name_.field_2._M_allocated_capacity = local_12c8._M_allocated_capacity;
            local_708.source_name_._M_string_length = (size_type)local_12d0;
            local_12d0 = (pointer)0x0;
            local_12c8._M_allocated_capacity = local_12c8._M_allocated_capacity & 0xffffffffffffff00
            ;
            local_708.last_column_ = local_1288;
            local_708.first_line_ = CONCAT44(uStack_12a4,local_12a8);
            local_708.first_column_ = CONCAT44(uStack_129c,uStack_12a0);
            local_708.last_ = local_1298;
            local_708.last_line_ = sStack_1290;
            local_708.length_ = local_12b8;
            local_708.first_ = sStack_12b0;
            local_12d8._M_p = (pointer)&local_12c8;
            basic_value<toml::type_config>::basic_value
                      (&local_290,(basic_value<toml::type_config> *)local_10c8);
            pEVar25 = (EVP_PKEY_CTX *)0x1;
            insert_value<toml::type_config>
                      ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                       local_1398,array_table,ptVar18,&local_1308,&local_708,&local_290);
            basic_value<toml::type_config>::cleanup(&local_290,pEVar25);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_10d0->comments);
            region::~region(&local_290.region_);
            region::~region(&local_708);
            if (local_1398[0] == (string)0x0) {
              peVar20 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap_err
                                  ((result<toml::basic_value<toml::type_config>_*,_toml::error_info>
                                    *)local_1398,(source_location)0x555cf0);
              local_d08._0_8_ = local_d08 + 0x10;
              pcVar5 = (peVar20->title_)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_d08,pcVar5,pcVar5 + (peVar20->title_)._M_string_length);
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_d08 + 0x20),&peVar20->locations_);
              local_cd0._M_p = (pointer)&local_cc0;
              pcVar5 = (peVar20->suffix_)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_cd0,pcVar5,pcVar5 + (peVar20->suffix_)._M_string_length);
              std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
              emplace_back<toml::error_info>
                        ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar26,
                         (error_info *)local_d08);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_cd0._M_p != &local_cc0) {
                operator_delete(local_cd0._M_p,local_cc0._M_allocated_capacity + 1);
              }
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_d08 + 0x20));
              if ((undefined1 *)local_d08._0_8_ != local_d08 + 0x10) {
                operator_delete((void *)local_d08._0_8_,local_d08._16_8_ + 1);
              }
              local_a58._M_buckets = &local_a58._M_single_bucket;
              local_a58._M_bucket_count = 1;
              local_a58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              local_a58._M_element_count = 0;
              local_a58._M_rehash_policy._M_max_load_factor = 1.0;
              local_a58._M_rehash_policy._4_4_ = 0;
              local_a58._M_rehash_policy._M_next_resize = 0;
              local_a58._M_single_bucket = (__node_base_ptr)0x0;
              basic_value<toml::type_config>::basic_value
                        ((basic_value<toml::type_config> *)local_c20,(table_type *)&local_a58);
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable(&local_a58);
              parse_table<toml::type_config>
                        ((result<toml::detail::none_t,_toml::error_info> *)local_1278,loc,ctx,
                         (basic_value<toml::type_config> *)local_c20);
              if ((bool)local_1278[0] == false) {
                peVar15 = result<toml::detail::none_t,_toml::error_info>::unwrap_err
                                    ((result<toml::detail::none_t,_toml::error_info> *)local_1278,
                                     (source_location)0x555d08);
                local_d60._0_8_ = local_d60 + 0x10;
                pcVar5 = (peVar15->title_)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_d60,pcVar5,pcVar5 + (peVar15->title_)._M_string_length);
                std::
                vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(local_d60 + 0x20),&peVar15->locations_);
                local_d28._M_p = (pointer)&local_d18;
                pcVar5 = (peVar15->suffix_)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_d28,pcVar5,pcVar5 + (peVar15->suffix_)._M_string_length)
                ;
                std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
                emplace_back<toml::error_info>
                          ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar26,
                           (error_info *)local_d60);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d28._M_p != &local_d18) {
                  operator_delete(local_d28._M_p,local_d18._M_allocated_capacity + 1);
                }
                std::
                vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(local_d60 + 0x20));
                if ((undefined1 *)local_d60._0_8_ != local_d60 + 0x10) {
                  operator_delete((void *)local_d60._0_8_,local_d60._16_8_ + 1);
                }
                plVar23 = (location *)ctx;
                skip_until_next_table<toml::type_config>(loc,ctx);
LAB_003b9dae:
              }
LAB_003b9db5:
              if ((local_1278[0] & 1) == 0) {
                failure<toml::error_info>::~failure(&local_1270.fail_);
              }
              basic_value<toml::type_config>::cleanup
                        ((basic_value<toml::type_config> *)local_c20,(EVP_PKEY_CTX *)plVar23);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(local_1218);
              region::~region((region *)(local_c18 + 0x40));
            }
            else {
              ppbVar19 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap
                                   ((result<toml::basic_value<toml::type_config>_*,_toml::error_info>
                                     *)local_1398,(source_location)0x555d20);
              pbVar21 = *ppbVar19;
              parse_table<toml::type_config>
                        ((result<toml::detail::none_t,_toml::error_info> *)local_c20,loc,ctx,pbVar21
                        );
              if (local_c20[0] == false) {
                peVar15 = result<toml::detail::none_t,_toml::error_info>::unwrap_err
                                    ((result<toml::detail::none_t,_toml::error_info> *)local_c20,
                                     (source_location)0x555d38);
                local_db8._0_8_ = local_db8 + 0x10;
                pcVar5 = (peVar15->title_)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_db8,pcVar5,pcVar5 + (peVar15->title_)._M_string_length);
                std::
                vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(local_db8 + 0x20),&peVar15->locations_);
                local_d80._M_p = (pointer)&local_d70;
                pcVar5 = (peVar15->suffix_)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_d80,pcVar5,pcVar5 + (peVar15->suffix_)._M_string_length)
                ;
                std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
                emplace_back<toml::error_info>
                          ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar26,
                           (error_info *)local_db8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d80._M_p != &local_d70) {
                  operator_delete(local_d80._M_p,local_d70._M_allocated_capacity + 1);
                }
                std::
                vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(local_db8 + 0x20));
                if ((undefined1 *)local_db8._0_8_ != local_db8 + 0x10) {
                  operator_delete((void *)local_db8._0_8_,local_db8._16_8_ + 1);
                }
                plVar23 = (location *)ctx;
                skip_until_next_table<toml::type_config>(loc,ctx);
              }
              if ((local_13b8 == true) && (uVar7 = local_13d8[1], local_13d8[1] != none)) {
                ptVar12 = basic_value<toml::type_config>::as_table_fmt(pbVar21);
                ptVar12->indent_type = uVar7;
                if (local_13b8 == false) {
                  std::__throw_bad_optional_access();
                }
                iVar28 = local_13d8._4_4_;
                ptVar12 = basic_value<toml::type_config>::as_table_fmt(pbVar21);
LAB_003b9b36:
                ptVar12->name_indent = iVar28;
              }
LAB_003b9b3a:
              if (local_c20[0] == false) {
                failure<toml::error_info>::~failure((failure<toml::error_info> *)local_c18);
              }
            }
            if (local_1398[0] == (string)0x0) {
              failure<toml::error_info>::~failure((failure<toml::error_info> *)(local_1398 + 8));
            }
            basic_value<toml::type_config>::cleanup
                      ((basic_value<toml::type_config> *)local_10c8,(EVP_PKEY_CTX *)plVar23);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(local_1210);
            region::~region((region *)(auStack_10c0 + 0x40));
          }
          else {
            peVar17 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                      ::unwrap_err((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                    *)local_c20,(source_location)0x555cd8);
            local_cb0._0_8_ = local_cb0 + 0x10;
            pcVar5 = (peVar17->title_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_cb0,pcVar5,pcVar5 + (peVar17->title_)._M_string_length);
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_cb0 + 0x20),&peVar17->locations_);
            local_c78._M_p = (pointer)&local_c68;
            pcVar5 = (peVar17->suffix_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c78,pcVar5,pcVar5 + (peVar17->suffix_)._M_string_length);
            std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
            emplace_back<toml::error_info>
                      ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar26,
                       (error_info *)local_cb0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c78._M_p != &local_c68) {
              operator_delete(local_c78._M_p,local_c68._M_allocated_capacity + 1);
            }
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(local_cb0 + 0x20));
            if ((undefined1 *)local_cb0._0_8_ != local_cb0 + 0x10) {
              operator_delete((void *)local_cb0._0_8_,local_cb0._16_8_ + 1);
            }
            plVar23 = (location *)ctx;
            skip_until_next_table<toml::type_config>(loc,ctx);
LAB_003b8ade:
            result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
            ::cleanup((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                       *)local_c20,(EVP_PKEY_CTX *)plVar23);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1338);
          region::~region((region *)local_12e8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1308);
          result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
          ::cleanup((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                     *)local_fa0,(EVP_PKEY_CTX *)plVar23);
          pbVar21 = extraout_RDX_03;
        }
        else {
          result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
          ::cleanup((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                     *)local_fa0,(EVP_PKEY_CTX *)plVar22);
          plVar22 = loc;
          parse_table_key<toml::type_config>
                    ((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                      *)local_fa0,loc,ctx);
          if (local_fa0[0] == (string)0x1) {
            pvVar16 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                      ::unwrap((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                                *)local_fa0,(source_location)0x555d50);
            local_1308.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pvVar16->first).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_1308.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pvVar16->first).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_1308.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pvVar16->first).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (pvVar16->first).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pvVar16->first).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pvVar16->first).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pvVar16 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                      ::unwrap((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                                *)local_fa0,(source_location)0x555d68);
            local_12e8._0_8_ =
                 (pvVar16->second).source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
            local_12e8._8_8_ =
                 (pvVar16->second).source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
            (pvVar16->second).source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            (pvVar16->second).source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            local_12d8._M_p = (pointer)&local_12c8;
            paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pvVar16->second).source_name_._M_dataplus._M_p;
            paVar14 = &(pvVar16->second).source_name_.field_2;
            if (paVar29 == paVar14) {
              local_12c8._M_allocated_capacity = paVar14->_M_allocated_capacity;
              local_12c8._8_8_ = *(undefined8 *)((long)&(pvVar16->second).source_name_.field_2 + 8);
            }
            else {
              local_12c8._M_allocated_capacity = paVar14->_M_allocated_capacity;
              local_12d8._M_p = (pointer)paVar29;
            }
            local_12d0 = (pointer)(pvVar16->second).source_name_._M_string_length;
            (pvVar16->second).source_name_._M_dataplus._M_p = (pointer)paVar14;
            (pvVar16->second).source_name_._M_string_length = 0;
            (pvVar16->second).source_name_.field_2._M_local_buf[0] = '\0';
            local_1288 = (pvVar16->second).last_column_;
            local_12b8 = (pvVar16->second).length_;
            sStack_12b0 = (pvVar16->second).first_;
            local_12a8 = (undefined4)(pvVar16->second).first_line_;
            uStack_12a4 = *(undefined4 *)((long)&(pvVar16->second).first_line_ + 4);
            uStack_12a0 = (undefined4)(pvVar16->second).first_column_;
            uStack_129c = *(undefined4 *)((long)&(pvVar16->second).first_column_ + 4);
            local_1298 = (pvVar16->second).last_;
            sStack_1290 = (pvVar16->second).last_line_;
            local_1328 = (pointer)0x0;
            local_1338 = (pointer)0x0;
            pbStack_1330 = (pointer)0x0;
            if (local_13b8 == true) {
              uVar33 = 0xffffffffffffffff;
              lVar31 = 0;
              while (uVar33 = uVar33 + 1,
                    uVar33 < (ulong)((long)local_13c8[0].scanner_._M_t.
                                           super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                                           .
                                           super__Head_base<0UL,_toml::detail::scanner_base_*,_false>
                                           ._M_head_impl - local_13d8._8_8_ >> 5)) {
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_1338,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&((_Alloc_hider *)local_13d8._8_8_)->_M_p + lVar31));
                lVar31 = lVar31 + 0x20;
                if (local_13b8 == false) {
                  std::__throw_bad_optional_access();
                }
              }
            }
            parse_comment_line<toml::type_config>
                      ((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                        *)local_c20,loc,ctx);
            if (local_c20[0] == true) {
              pvVar13 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                        ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                  *)local_c20,(source_location)0x555d80);
              local_1390.value.title_.field_2._M_local_buf[8] = '\0';
              if ((pvVar13->
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  )._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_engaged == true) {
                local_1398 = (undefined1  [8])&local_1390.value.title_._M_string_length;
                _Var27._M_p = (pvVar13->
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1398,_Var27._M_p,
                           _Var27._M_p +
                           (pvVar13->
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           )._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._M_value._M_string_length);
                local_1390.value.title_.field_2._M_local_buf[8] = '\x01';
                _Var24._M_head_impl = (scanner_base *)local_1398;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_1338,(value_type *)_Var24._M_head_impl);
              }
              else {
                _Var24._M_head_impl = (scanner_base *)ctx;
                skip_whitespace<toml::type_config>(loc,ctx);
                peVar3 = (loc->source_).
                         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                if (loc->location_ <
                    (ulong)((long)(peVar3->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(peVar3->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_start)) {
                  local_11f0 = &PTR__scanner_base_00555890;
                  local_11e8 = 10;
                  local_13b0.super_scanner_base._vptr_scanner_base =
                       (_func_int **)&PTR__scanner_base_005559a8;
                  local_13b0.value_ = "\r\n";
                  local_13b0.size_ = 2;
                  _Var24._M_head_impl = (scanner_base *)&local_11f0;
                  either::either<toml::detail::character,toml::detail::literal>
                            ((either *)local_1278,(character *)_Var24._M_head_impl,&local_13b0);
                  uVar8 = local_1270.fail_.value.title_._M_string_length;
                  for (uVar34 = local_1270.fail_.value.title_._M_dataplus._M_p; uVar34 != uVar8;
                      uVar34 = uVar34 + 8) {
                    _Var24._M_head_impl = *(scanner_base **)uVar34;
                    (**(code **)(*(long *)_Var24._M_head_impl + 0x10))
                              ((region *)local_10c8,_Var24._M_head_impl,loc);
                    auVar9 = local_10c8;
                    region::~region((region *)local_10c8);
                    if (auVar9 != (undefined1  [8])0x0) {
                      std::
                      vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                      ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                                 *)&local_1270.fail_);
                      goto LAB_003b978f;
                    }
                  }
                  region::region((region *)local_10c8);
                  auVar9 = local_10c8;
                  region::~region((region *)local_10c8);
                  std::
                  vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                  ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                             *)&local_1270.fail_);
                  if (auVar9 == (undefined1  [8])0x0) {
                    local_11e0._M_dataplus._M_p = (pointer)&local_11e0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_11e0,"toml::parse_file: newline (or EOF) expected",
                               "");
                    local_13b0.super_scanner_base._vptr_scanner_base =
                         (_func_int **)&PTR__scanner_base_00555890;
                    local_13b0.value_ = (char *)CONCAT71(local_13b0.value_._1_7_,10);
                    local_1278 = (undefined1  [8])&PTR__scanner_base_005559a8;
                    local_1270.fail_.value.title_._M_dataplus._M_p = (_Alloc_hider)"\r\n";
                    local_1270.fail_.value.title_._M_string_length = 2;
                    either::either<toml::detail::character,toml::detail::literal>
                              ((either *)local_10c8,(character *)&local_13b0,(literal *)local_1278);
                    location::location(&local_598,loc);
                    local_1120._M_dataplus._M_p = (pointer)&local_1120.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1120,"");
                    make_syntax_error<toml::detail::either>
                              (&local_938,&local_11e0,(either *)local_10c8,&local_598,&local_1120);
                    std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
                    emplace_back<toml::error_info>
                              ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)
                               pbVar26,&local_938);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_938.suffix_._M_dataplus._M_p != &local_938.suffix_.field_2) {
                      operator_delete(local_938.suffix_._M_dataplus._M_p,
                                      local_938.suffix_.field_2._M_allocated_capacity + 1);
                    }
                    std::
                    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::~vector(&local_938.locations_);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_938.title_._M_dataplus._M_p != &local_938.title_.field_2) {
                      operator_delete(local_938.title_._M_dataplus._M_p,
                                      local_938.title_.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1120._M_dataplus._M_p != &local_1120.field_2) {
                      operator_delete(local_1120._M_dataplus._M_p,
                                      local_1120.field_2._M_allocated_capacity + 1);
                    }
                    location::~location(&local_598);
                    std::
                    vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                    ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                               *)auStack_10c0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_dataplus._M_p != &local_11e0.field_2) {
                      operator_delete(local_11e0._M_dataplus._M_p,
                                      (ulong)(local_11e0.field_2._M_allocated_capacity + 1));
                    }
                    plVar23 = (location *)ctx;
                    skip_until_next_table<toml::type_config>(loc,ctx);
                    goto LAB_003b9118;
                  }
                }
              }
LAB_003b978f:
              if ((local_1390.value.title_.field_2._M_local_buf[8] == '\x01') &&
                 (local_1390.value.title_.field_2._M_local_buf[8] = '\0',
                 local_1398 != (undefined1  [8])&local_1390.value.title_._M_string_length)) {
                _Var24._M_head_impl = (scanner_base *)(local_1390.value.title_._M_string_length + 1)
                ;
                operator_delete((void *)local_1398,(ulong)_Var24._M_head_impl);
              }
              result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
              ::cleanup((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                         *)local_c20,(EVP_PKEY_CTX *)_Var24._M_head_impl);
              local_a90._M_buckets = &local_a90._M_single_bucket;
              local_a90._M_bucket_count = 1;
              local_a90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              local_a90._M_element_count = 0;
              local_a90._M_rehash_policy._M_max_load_factor = 1.0;
              local_a90._M_rehash_policy._4_4_ = 0;
              local_a90._M_rehash_policy._M_next_resize = 0;
              local_a90._M_single_bucket = (__node_base_ptr)0x0;
              local_b58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = local_1338;
              local_b58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbStack_1330;
              local_b58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1328;
              local_1328 = (pointer)0x0;
              local_1338 = (pointer)0x0;
              pbStack_1330 = (pointer)0x0;
              region::region(&local_100,(region *)local_12e8);
              fmt_00._0_8_ = (ulong)((uint)local_10d8 & 0xffff0000) | 0x200;
              fmt_00.name_indent = 0;
              fmt_00.closing_indent = 0;
              local_10d8 = fmt_00._0_8_;
              basic_value<toml::type_config>::basic_value
                        ((basic_value<toml::type_config> *)local_10c8,(table_type *)&local_a90,
                         fmt_00,&local_b58,&local_100);
              region::~region(&local_100);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_b58);
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable(&local_a90);
              ptVar18 = basic_value<toml::type_config>::as_table_abi_cxx11_
                                  ((basic_value<toml::type_config> *)local_840);
              local_778.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)local_12e8._0_8_;
              local_778.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_12e8._8_8_;
              local_12e8._0_8_ = (element_type *)0x0;
              local_12e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_778.source_name_._M_dataplus._M_p = (pointer)&local_778.source_name_.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_12d8._M_p == &local_12c8) {
                local_778.source_name_.field_2._8_8_ = local_12c8._8_8_;
              }
              else {
                local_778.source_name_._M_dataplus._M_p = local_12d8._M_p;
              }
              local_778.source_name_.field_2._M_allocated_capacity =
                   local_12c8._M_allocated_capacity;
              local_778.source_name_._M_string_length = (size_type)local_12d0;
              local_12d0 = (pointer)0x0;
              local_12c8._M_allocated_capacity =
                   local_12c8._M_allocated_capacity & 0xffffffffffffff00;
              local_778.last_column_ = local_1288;
              local_778.first_line_ = CONCAT44(uStack_12a4,local_12a8);
              local_778.first_column_ = CONCAT44(uStack_129c,uStack_12a0);
              local_778.last_ = local_1298;
              local_778.last_line_ = sStack_1290;
              local_778.length_ = local_12b8;
              local_778.first_ = sStack_12b0;
              local_12d8._M_p = (pointer)&local_12c8;
              basic_value<toml::type_config>::basic_value
                        (&local_358,(basic_value<toml::type_config> *)local_10c8);
              pEVar25 = (EVP_PKEY_CTX *)0x0;
              insert_value<toml::type_config>
                        ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                         local_1398,std_table,ptVar18,&local_1308,&local_778,&local_358);
              basic_value<toml::type_config>::cleanup(&local_358,pEVar25);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_10e0->comments);
              region::~region(&local_358.region_);
              region::~region(&local_778);
              if (local_1398[0] == (string)0x0) {
                peVar20 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::
                          unwrap_err((result<toml::basic_value<toml::type_config>_*,_toml::error_info>
                                      *)local_1398,(source_location)0x555db0);
                local_e68._0_8_ = local_e68 + 0x10;
                pcVar5 = (peVar20->title_)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_e68,pcVar5,pcVar5 + (peVar20->title_)._M_string_length);
                std::
                vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(local_e68 + 0x20),&peVar20->locations_);
                local_e30._M_p = (pointer)&local_e20;
                pcVar5 = (peVar20->suffix_)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_e30,pcVar5,pcVar5 + (peVar20->suffix_)._M_string_length)
                ;
                std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
                emplace_back<toml::error_info>
                          ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar26,
                           (error_info *)local_e68);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e30._M_p != &local_e20) {
                  operator_delete(local_e30._M_p,local_e20._M_allocated_capacity + 1);
                }
                std::
                vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(local_e68 + 0x20));
                if ((undefined1 *)local_e68._0_8_ != local_e68 + 0x10) {
                  operator_delete((void *)local_e68._0_8_,local_e68._16_8_ + 1);
                }
                local_ac8._M_buckets = &local_ac8._M_single_bucket;
                local_ac8._M_bucket_count = 1;
                local_ac8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                local_ac8._M_element_count = 0;
                local_ac8._M_rehash_policy._M_max_load_factor = 1.0;
                local_ac8._M_rehash_policy._4_4_ = 0;
                local_ac8._M_rehash_policy._M_next_resize = 0;
                local_ac8._M_single_bucket = (__node_base_ptr)0x0;
                basic_value<toml::type_config>::basic_value
                          ((basic_value<toml::type_config> *)local_c20,(table_type *)&local_ac8);
                std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::~_Hashtable(&local_ac8);
                parse_table<toml::type_config>
                          ((result<toml::detail::none_t,_toml::error_info> *)local_1278,loc,ctx,
                           (basic_value<toml::type_config> *)local_c20);
                if ((bool)local_1278[0] == false) {
                  peVar15 = result<toml::detail::none_t,_toml::error_info>::unwrap_err
                                      ((result<toml::detail::none_t,_toml::error_info> *)local_1278,
                                       (source_location)0x555dc8);
                  local_ec0._0_8_ = local_ec0 + 0x10;
                  pcVar5 = (peVar15->title_)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_ec0,pcVar5,pcVar5 + (peVar15->title_)._M_string_length)
                  ;
                  std::
                  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)(local_ec0 + 0x20),&peVar15->locations_);
                  local_e88._M_p = (pointer)&local_e78;
                  pcVar5 = (peVar15->suffix_)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_e88,pcVar5,
                             pcVar5 + (peVar15->suffix_)._M_string_length);
                  std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
                  emplace_back<toml::error_info>
                            ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar26,
                             (error_info *)local_ec0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e88._M_p != &local_e78) {
                    operator_delete(local_e88._M_p,local_e78._M_allocated_capacity + 1);
                  }
                  std::
                  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(local_ec0 + 0x20));
                  if ((undefined1 *)local_ec0._0_8_ != local_ec0 + 0x10) {
                    operator_delete((void *)local_ec0._0_8_,local_ec0._16_8_ + 1);
                  }
                  plVar23 = (location *)ctx;
                  skip_until_next_table<toml::type_config>(loc,ctx);
                  goto LAB_003b9dae;
                }
                goto LAB_003b9db5;
              }
              ppbVar19 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap
                                   ((result<toml::basic_value<toml::type_config>_*,_toml::error_info>
                                     *)local_1398,(source_location)0x555de0);
              pbVar21 = *ppbVar19;
              parse_table<toml::type_config>
                        ((result<toml::detail::none_t,_toml::error_info> *)local_c20,loc,ctx,pbVar21
                        );
              if (local_c20[0] == false) {
                peVar15 = result<toml::detail::none_t,_toml::error_info>::unwrap_err
                                    ((result<toml::detail::none_t,_toml::error_info> *)local_c20,
                                     (source_location)0x555df8);
                local_f18._0_8_ = local_f18 + 0x10;
                pcVar5 = (peVar15->title_)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_f18,pcVar5,pcVar5 + (peVar15->title_)._M_string_length);
                std::
                vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(local_f18 + 0x20),&peVar15->locations_);
                local_ee0._M_p = (pointer)&local_ed0;
                pcVar5 = (peVar15->suffix_)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_ee0,pcVar5,pcVar5 + (peVar15->suffix_)._M_string_length)
                ;
                std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
                emplace_back<toml::error_info>
                          ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar26,
                           (error_info *)local_f18);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_ee0._M_p != &local_ed0) {
                  operator_delete(local_ee0._M_p,local_ed0._M_allocated_capacity + 1);
                }
                std::
                vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(local_f18 + 0x20));
                if ((undefined1 *)local_f18._0_8_ != local_f18 + 0x10) {
                  operator_delete((void *)local_f18._0_8_,local_f18._16_8_ + 1);
                }
                plVar23 = (location *)ctx;
                skip_until_next_table<toml::type_config>(loc,ctx);
              }
              if ((local_13b8 == true) && (uVar7 = local_13d8[1], local_13d8[1] != none)) {
                ptVar12 = basic_value<toml::type_config>::as_table_fmt(pbVar21);
                ptVar12->indent_type = uVar7;
                if (local_13b8 == false) {
                  std::__throw_bad_optional_access();
                }
                iVar28 = local_13d8._4_4_;
                ptVar12 = basic_value<toml::type_config>::as_table_fmt(pbVar21);
                goto LAB_003b9b36;
              }
              goto LAB_003b9b3a;
            }
            peVar17 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                      ::unwrap_err((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                    *)local_c20,(source_location)0x555d98);
            local_e10._0_8_ = local_e10 + 0x10;
            pcVar5 = (peVar17->title_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_e10,pcVar5,pcVar5 + (peVar17->title_)._M_string_length);
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_e10 + 0x20),&peVar17->locations_);
            local_dd8._M_p = (pointer)&local_dc8;
            pcVar5 = (peVar17->suffix_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_dd8,pcVar5,pcVar5 + (peVar17->suffix_)._M_string_length);
            std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
            emplace_back<toml::error_info>
                      ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar26,
                       (error_info *)local_e10);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_dd8._M_p != &local_dc8) {
              operator_delete(local_dd8._M_p,local_dc8._M_allocated_capacity + 1);
            }
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(local_e10 + 0x20));
            if ((undefined1 *)local_e10._0_8_ != local_e10 + 0x10) {
              operator_delete((void *)local_e10._0_8_,local_e10._16_8_ + 1);
            }
            plVar23 = (location *)ctx;
            skip_until_next_table<toml::type_config>(loc,ctx);
            goto LAB_003b8ade;
          }
          result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
          ::cleanup((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                     *)local_fa0,(EVP_PKEY_CTX *)plVar22);
          location::location((location *)local_c20,loc);
          local_fa0._0_8_ = &PTR__scanner_base_005559a8;
          local_fa0._8_8_ = "[[";
          local_f90[0] = (undefined *)0x2;
          literal::scan((region *)local_10c8,(literal *)local_fa0,loc);
          auVar9 = local_10c8;
          region::~region((region *)local_10c8);
          (loc->source_).
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)CONCAT71(local_c20._1_7_,local_c20[0]);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (local_11f8,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_c18);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (local_1200,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_c18 + 8));
          local_1208[2] = local_c18._56_8_;
          *(undefined4 *)local_1208 = local_c18._40_4_;
          *(undefined4 *)((long)local_1208 + 4) = local_c18._44_4_;
          *(undefined4 *)(local_1208 + 1) = local_c18._48_4_;
          *(undefined4 *)((long)local_1208 + 0xc) = local_c18._52_4_;
          if (auVar9 == (undefined1  [8])0x0) {
            local_1180._M_dataplus._M_p = (pointer)&local_1180.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1180,"toml::parse_file: invalid table key","");
            syntax::std_table((sequence *)local_10c8,&ctx->toml_spec_);
            location::location(&local_628,loc);
            local_11a0._M_dataplus._M_p = (pointer)&local_11a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_11a0,"");
            make_syntax_error<toml::detail::sequence>
                      (&local_9e8,&local_1180,(sequence *)local_10c8,&local_628,&local_11a0);
            std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
            emplace_back<toml::error_info>
                      ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar26,
                       &local_9e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_9e8.suffix_._M_dataplus._M_p != &local_9e8.suffix_.field_2) {
              operator_delete(local_9e8.suffix_._M_dataplus._M_p,
                              local_9e8.suffix_.field_2._M_allocated_capacity + 1);
            }
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector(&local_9e8.locations_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_9e8.title_._M_dataplus._M_p != &local_9e8.title_.field_2) {
              operator_delete(local_9e8.title_._M_dataplus._M_p,
                              local_9e8.title_.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_11a0._M_dataplus._M_p != &local_11a0.field_2) {
              operator_delete(local_11a0._M_dataplus._M_p,
                              local_11a0.field_2._M_allocated_capacity + 1);
            }
            location::~location(&local_628);
            std::
            vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
            ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)auStack_10c0);
            psVar6 = &local_1180;
            _Var27._M_p = local_1180._M_dataplus._M_p;
          }
          else {
            local_1140._M_dataplus._M_p = (pointer)&local_1140.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1140,"toml::parse_file: invalid array-table key","");
            syntax::array_table((sequence *)local_10c8,&ctx->toml_spec_);
            location::location(&local_5e0,loc);
            local_1160._M_dataplus._M_p = (pointer)&local_1160.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1160,"");
            make_syntax_error<toml::detail::sequence>
                      (&local_990,&local_1140,(sequence *)local_10c8,&local_5e0,&local_1160);
            std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
            emplace_back<toml::error_info>
                      ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar26,
                       &local_990);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_990.suffix_._M_dataplus._M_p != &local_990.suffix_.field_2) {
              operator_delete(local_990.suffix_._M_dataplus._M_p,
                              local_990.suffix_.field_2._M_allocated_capacity + 1);
            }
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector(&local_990.locations_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_990.title_._M_dataplus._M_p != &local_990.title_.field_2) {
              operator_delete(local_990.title_._M_dataplus._M_p,
                              local_990.title_.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1160._M_dataplus._M_p != &local_1160.field_2) {
              operator_delete(local_1160._M_dataplus._M_p,
                              local_1160.field_2._M_allocated_capacity + 1);
            }
            location::~location(&local_5e0);
            std::
            vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
            ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)auStack_10c0);
            psVar6 = &local_1140;
            _Var27._M_p = local_1140._M_dataplus._M_p;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var27._M_p != &psVar6->field_2) {
            operator_delete(_Var27._M_p,(psVar6->field_2)._M_allocated_capacity + 1);
          }
          skip_until_next_table<toml::type_config>(loc,ctx);
          location::~location((location *)local_c20);
          pbVar21 = extraout_RDX_02;
        }
        if (local_13b8 == true) {
          local_13b8 = false;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_13d8 + 8));
          pbVar21 = extraout_RDX_04;
        }
        peVar3 = (loc->source_).
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      } while (loc->location_ <
               (ulong)((long)(peVar3->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(peVar3->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start));
    }
    if ((ctx->errors_).super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (ctx->errors_).super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ok<toml::basic_value<toml::type_config>>
                ((success<toml::basic_value<toml::type_config>_> *)&local_420,(toml *)local_840,
                 pbVar21);
      local_1318->is_ok_ = true;
      pbVar26 = &local_420;
      basic_value<toml::type_config>::basic_value(&(local_1318->field_1).succ_.value,pbVar26);
      basic_value<toml::type_config>::cleanup(&local_420,(EVP_PKEY_CTX *)pbVar26);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_420.comments_.comments);
      region::~region(&local_420.region_);
    }
    else {
      std::vector<toml::error_info,_std::allocator<toml::error_info>_>::vector
                ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)local_10c8,
                 (vector<toml::error_info,_std::allocator<toml::error_info>_> *)pbVar26);
      uVar34 = auStack_10c0._8_8_;
      uVar8 = auStack_10c0._0_8_;
      auVar9 = local_10c8;
      local_10c8 = (undefined1  [8])0x0;
      auStack_10c0._0_8_ = (pointer)0x0;
      auStack_10c0._8_8_ = (pointer)0x0;
      std::vector<toml::error_info,_std::allocator<toml::error_info>_>::~vector
                ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)local_10c8);
      local_1318->is_ok_ = false;
      *(undefined1 (*) [8])&local_1318->field_1 = auVar9;
      (local_1318->field_1).fail_.value.
      super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)uVar8;
      (local_1318->field_1).fail_.value.
      super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)uVar34;
      local_508.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_508.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_508.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<toml::error_info,_std::allocator<toml::error_info>_>::~vector(&local_508);
    }
    basic_value<toml::type_config>::cleanup
              ((basic_value<toml::type_config> *)local_840,(EVP_PKEY_CTX *)pbVar26);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_790);
    region::~region((region *)(local_840 + 0x48));
  }
  else {
    local_660._M_buckets = &local_660._M_single_bucket;
    local_660._M_bucket_count = 1;
    local_660._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_660._M_element_count = 0;
    local_660._M_rehash_policy._M_max_load_factor = 1.0;
    local_660._M_rehash_policy._4_4_ = 0;
    local_660._M_rehash_policy._M_next_resize = 0;
    local_660._M_single_bucket = (__node_base_ptr)0x0;
    local_c38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    region::region(&local_488,loc);
    basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)local_840,(table_type *)&local_660,
               (table_format_info)ZEXT816(0),&local_c38,&local_488);
    ok<toml::basic_value<toml::type_config>>
              ((success<toml::basic_value<toml::type_config>_> *)&local_1c8,(toml *)local_840,v);
    local_1318->is_ok_ = true;
    pbVar26 = &local_1c8;
    basic_value<toml::type_config>::basic_value(&(local_1318->field_1).succ_.value,&local_1c8);
    basic_value<toml::type_config>::cleanup(&local_1c8,(EVP_PKEY_CTX *)pbVar26);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c8.comments_.comments);
    region::~region(&local_1c8.region_);
    basic_value<toml::type_config>::cleanup
              ((basic_value<toml::type_config> *)local_840,(EVP_PKEY_CTX *)pbVar26);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_790);
    region::~region((region *)(local_840 + 0x48));
    region::~region(&local_488);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c38);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_660);
  }
  location::~location((location *)local_888);
  return local_1318;
}

Assistant:

result<basic_value<TC>, std::vector<error_info>>
parse_file(location& loc, context<TC>& ctx)
{
    using value_type = basic_value<TC>;
    using table_type = typename value_type::table_type;

    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    if(loc.eof())
    {
        return ok(value_type(table_type(), table_format_info{}, {}, region(loc)));
    }

    value_type root(table_type(), table_format_info{}, {}, region(loc));
    root.as_table_fmt().fmt = table_format::multiline;
    root.as_table_fmt().indent_type = indent_char::none;

    // parse top comment.
    //
    // ```toml
    // # this is a comment for the top-level table.
    //
    // key = "the first value"
    // ```
    //
    // ```toml
    // # this is a comment for "the first value".
    // key = "the first value"
    // ```
    while( ! loc.eof())
    {
        if(auto com_res = parse_comment_line(loc, ctx))
        {
            if(auto com_opt = com_res.unwrap())
            {
                root.comments().push_back(std::move(com_opt.value()));
            }
            else // no comment found.
            {
                // if it is not an empty line, clear the root comment.
                if( ! sequence(syntax::ws(spec), syntax::newline(spec)).scan(loc).is_ok())
                {
                    loc = first;
                    root.comments().clear();
                }
                break;
            }
        }
        else
        {
            ctx.report_error(std::move(com_res.unwrap_err()));
            skip_comment_block(loc, ctx);
        }
    }

    // parse root table
    {
        const auto res = parse_table(loc, ctx, root);
        if(res.is_err())
        {
            ctx.report_error(std::move(res.unwrap_err()));
            skip_until_next_table(loc, ctx);
        }
    }

    // parse tables

    while( ! loc.eof())
    {
        auto sp = skip_multiline_spacer(loc, ctx, /*newline_found=*/true);

        if(auto key_res = parse_array_table_key(loc, ctx))
        {
            auto key = std::move(std::get<0>(key_res.unwrap()));
            auto reg = std::move(std::get<1>(key_res.unwrap()));

            std::vector<std::string> com;
            if(sp.has_value())
            {
                for(std::size_t i=0; i<sp.value().comments.size(); ++i)
                {
                    com.push_back(std::move(sp.value().comments.at(i)));
                }
            }

            // [table.def] must be followed by one of
            // - a comment line
            // - whitespace + newline
            // - EOF
            if(auto com_res = parse_comment_line(loc, ctx))
            {
                if(auto com_opt = com_res.unwrap())
                {
                    com.push_back(com_opt.value());
                }
                else // if there is no comment, ws+newline must exist (or EOF)
                {
                    skip_whitespace(loc, ctx);
                    if( ! loc.eof() && ! syntax::newline(ctx.toml_spec()).scan(loc).is_ok())
                    {
                        ctx.report_error(make_syntax_error("toml::parse_file: "
                            "newline (or EOF) expected",
                            syntax::newline(ctx.toml_spec()), loc));
                        skip_until_next_table(loc, ctx);
                        continue;
                    }
                }
            }
            else // comment syntax error (rare)
            {
                ctx.report_error(com_res.unwrap_err());
                skip_until_next_table(loc, ctx);
                continue;
            }

            table_format_info fmt;
            fmt.fmt = table_format::multiline;
            fmt.indent_type = indent_char::none;
            auto tab = value_type(table_type{}, std::move(fmt), std::move(com), reg);

            auto inserted = insert_value(inserting_value_kind::array_table,
                std::addressof(root.as_table()),
                key, std::move(reg), std::move(tab));

            if(inserted.is_err())
            {
                ctx.report_error(inserted.unwrap_err());

                // check errors in the table
                auto tmp = basic_value<TC>(table_type());
                auto res = parse_table(loc, ctx, tmp);
                if(res.is_err())
                {
                    ctx.report_error(res.unwrap_err());
                    skip_until_next_table(loc, ctx);
                }
                continue;
            }

            auto tab_ptr = inserted.unwrap();
            assert(tab_ptr);

            const auto tab_res = parse_table(loc, ctx, *tab_ptr);
            if(tab_res.is_err())
            {
                ctx.report_error(tab_res.unwrap_err());
                skip_until_next_table(loc, ctx);
            }

            // parse_table first clears `indent_type`.
            // to keep header indent info, we must store it later.
            if(sp.has_value() && sp.value().indent_type != indent_char::none)
            {
                tab_ptr->as_table_fmt().indent_type = sp.value().indent_type;
                tab_ptr->as_table_fmt().name_indent = sp.value().indent;
            }
            continue;
        }
        if(auto key_res = parse_table_key(loc, ctx))
        {
            auto key = std::move(std::get<0>(key_res.unwrap()));
            auto reg = std::move(std::get<1>(key_res.unwrap()));

            std::vector<std::string> com;
            if(sp.has_value())
            {
                for(std::size_t i=0; i<sp.value().comments.size(); ++i)
                {
                    com.push_back(std::move(sp.value().comments.at(i)));
                }
            }

            // [table.def] must be followed by one of
            // - a comment line
            // - whitespace + newline
            // - EOF
            if(auto com_res = parse_comment_line(loc, ctx))
            {
                if(auto com_opt = com_res.unwrap())
                {
                    com.push_back(com_opt.value());
                }
                else // if there is no comment, ws+newline must exist (or EOF)
                {
                    skip_whitespace(loc, ctx);
                    if( ! loc.eof() && ! syntax::newline(ctx.toml_spec()).scan(loc).is_ok())
                    {
                        ctx.report_error(make_syntax_error("toml::parse_file: "
                            "newline (or EOF) expected",
                            syntax::newline(ctx.toml_spec()), loc));
                        skip_until_next_table(loc, ctx);
                        continue;
                    }
                }
            }
            else // comment syntax error (rare)
            {
                ctx.report_error(com_res.unwrap_err());
                skip_until_next_table(loc, ctx);
                continue;
            }

            table_format_info fmt;
            fmt.fmt = table_format::multiline;
            fmt.indent_type = indent_char::none;
            auto tab = value_type(table_type{}, std::move(fmt), std::move(com), reg);

            auto inserted = insert_value(inserting_value_kind::std_table,
                std::addressof(root.as_table()),
                key, std::move(reg), std::move(tab));

            if(inserted.is_err())
            {
                ctx.report_error(inserted.unwrap_err());

                // check errors in the table
                auto tmp = basic_value<TC>(table_type());
                auto res = parse_table(loc, ctx, tmp);
                if(res.is_err())
                {
                    ctx.report_error(res.unwrap_err());
                    skip_until_next_table(loc, ctx);
                }
                continue;
            }

            auto tab_ptr = inserted.unwrap();
            assert(tab_ptr);

            const auto tab_res = parse_table(loc, ctx, *tab_ptr);
            if(tab_res.is_err())
            {
                ctx.report_error(tab_res.unwrap_err());
                skip_until_next_table(loc, ctx);
            }
            if(sp.has_value() && sp.value().indent_type != indent_char::none)
            {
                tab_ptr->as_table_fmt().indent_type = sp.value().indent_type;
                tab_ptr->as_table_fmt().name_indent = sp.value().indent;
            }
            continue;
        }

        // does not match array_table nor std_table. report an error.
        const auto keytop = loc;
        const auto maybe_array_of_tables = literal("[[").scan(loc).is_ok();
        loc = keytop;

        if(maybe_array_of_tables)
        {
            ctx.report_error(make_syntax_error("toml::parse_file: invalid array-table key",
                syntax::array_table(spec), loc));
        }
        else
        {
            ctx.report_error(make_syntax_error("toml::parse_file: invalid table key",
                syntax::std_table(spec), loc));
        }
        skip_until_next_table(loc, ctx);
    }

    if( ! ctx.errors().empty())
    {
        return err(std::move(ctx.errors()));
    }
    return ok(std::move(root));
}